

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# confparse.cpp
# Opt level: O3

bool __thiscall Confparse::ParseBool(Confparse *this,char *key,bool defaultv)

{
  int iVar1;
  char *__s1;
  
  __s1 = Parse(this,key);
  if (__s1 != (char *)0x0) {
    iVar1 = strncmp(__s1,"true",5);
    defaultv = iVar1 == 0;
  }
  return defaultv;
}

Assistant:

bool Confparse::ParseBool(const char *key, bool defaultv) {
	char *p = Parse(key);
	if (p) {
		if (strncmp(p, "true", sizeof("true")) == 0) {
			return true;
		} else
			return false;
	} else
		return defaultv;
}